

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O2

int32_t __thiscall
llama_vocab::tokenize
          (llama_vocab *this,char *text,int32_t text_len,llama_token *tokens,int32_t n_tokens_max,
          bool add_special,bool parse_special)

{
  ulong uVar1;
  ulong uVar2;
  _Vector_base<int,_std::allocator<int>_> local_68;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,text,text + text_len);
  tokenize((vector<int,_std::allocator<int>_> *)&local_68,this,&local_50,add_special,parse_special);
  ::std::__cxx11::string::~string((string *)&local_50);
  uVar2 = (long)local_68._M_impl.super__Vector_impl_data._M_finish -
          (long)local_68._M_impl.super__Vector_impl_data._M_start >> 2;
  if (n_tokens_max < (int)uVar2) {
    uVar2 = (ulong)(uint)-(int)uVar2;
  }
  else {
    for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      tokens[uVar1] = local_68._M_impl.super__Vector_impl_data._M_start[uVar1];
    }
  }
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
  return (int32_t)uVar2;
}

Assistant:

int32_t llama_vocab::tokenize(
                  const char * text,
                     int32_t   text_len,
                 llama_token * tokens,
                     int32_t   n_tokens_max,
                        bool   add_special,
                        bool   parse_special) const {
    auto res = tokenize(std::string(text, text_len), add_special, parse_special);
    if (n_tokens_max < (int) res.size()) {
        // LLAMA_LOG_ERROR("%s: too many tokens\n", __func__);
        return -((int) res.size());
    }

    for (size_t i = 0; i < res.size(); i++) {
        tokens[i] = res[i];
    }

    return res.size();
}